

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O2

void __thiscall DSDcc::DSDDstar::DStarHeader::setRpt2(DStarHeader *this,char *rpt2,bool fromHD)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((byte)(this->m_rpt2FromHD ^ 1U | fromHD) == 1) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,rpt2,rpt2 + 8);
    std::__cxx11::string::operator=((string *)&this->m_rpt2,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    this->m_rpt2FromHD = fromHD;
  }
  return;
}

Assistant:

void setRpt2(const char *rpt2, bool fromHD)
       {
           if (!m_rpt2FromHD || fromHD)
           {
               m_rpt2 = std::string(rpt2, 8);
               m_rpt2FromHD = fromHD;
           }
       }